

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ConvertToHalfPass::IsArithmetic(ConvertToHalfPass *this,Instruction *inst)

{
  uint32_t uVar1;
  size_type sVar2;
  FeatureManager *pFVar3;
  size_type sVar4;
  bool bVar5;
  uint32_t local_28;
  Op local_24;
  
  local_24 = inst->opcode_;
  sVar2 = std::
          _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::ConvertToHalfPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->target_ops_core_)._M_h,&local_24);
  bVar5 = true;
  if (sVar2 == 0) {
    if (inst->opcode_ == OpExtInst) {
      bVar5 = false;
      uVar1 = Instruction::GetSingleWordInOperand(inst,0);
      pFVar3 = IRContext::get_feature_mgr((this->super_Pass).context_);
      if (uVar1 == pFVar3->extinst_importid_GLSLstd450_) {
        uVar1 = Instruction::GetSingleWordInOperand(inst,1);
        _local_28 = CONCAT44(local_24,uVar1);
        sVar4 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&(this->target_ops_450_)._M_h,&local_28);
        bVar5 = sVar4 != 0;
      }
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool ConvertToHalfPass::IsArithmetic(Instruction* inst) {
  return target_ops_core_.count(inst->opcode()) != 0 ||
         (inst->opcode() == spv::Op::OpExtInst &&
          inst->GetSingleWordInOperand(0) ==
              context()->get_feature_mgr()->GetExtInstImportId_GLSLstd450() &&
          target_ops_450_.count(inst->GetSingleWordInOperand(1)) != 0);
}